

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

bool __thiscall duckdb::StringValueScanner::MoveToNextBuffer(StringValueScanner *this)

{
  CSVIterator *pCVar1;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_01;
  StringValueResult *result;
  int64_t *piVar2;
  idx_t *piVar3;
  CSVState CVar4;
  CSVState CVar5;
  ulong uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  tuple<duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_> tVar11;
  ClientContext *pCVar12;
  CSVBufferHandle *pCVar13;
  CSVBufferManager *pos;
  mapped_type *this_03;
  CSVStateMachine *pCVar14;
  undefined1 local_38;
  undefined7 uStack_37;
  ClientContext *pCStack_30;
  
  uVar6 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  this_00 = &(this->super_BaseScanner).cur_buffer_handle;
  pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
  if (uVar6 < pCVar13->actual_size) {
    return false;
  }
  this_01 = &this->previous_buffer_handle;
  shared_ptr<duckdb::CSVBufferHandle,_true>::operator=(this_01,this_00);
  pos = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                  (&(this->super_BaseScanner).buffer_manager);
  (this->super_BaseScanner).iterator.pos.buffer_idx =
       (this->super_BaseScanner).iterator.pos.buffer_idx + 1;
  CSVBufferManager::GetBuffer((CSVBufferManager *)&stack0xffffffffffffffc8,(idx_t)pos);
  pCVar12 = pCStack_30;
  tVar11.
  super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
  super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)
       (_Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)
       _local_38;
  _local_38 = (CSVFileHandle *)0x0;
  pCStack_30 = (ClientContext *)0x0;
  this_02 = (this->super_BaseScanner).cur_buffer_handle.internal.
            super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->super_BaseScanner).cur_buffer_handle.internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       tVar11.
       super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
       super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl;
  (this->super_BaseScanner).cur_buffer_handle.internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar12;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (pCStack_30 != (ClientContext *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_30);
  }
  if ((this_00->internal).super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    this_03 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&(this->result).buffer_handles,&pCVar13->buffer_idx);
    shared_ptr<duckdb::CSVBufferHandle,_true>::operator=(this_03,this_00);
    (this->super_BaseScanner).iterator.pos.buffer_pos = 0;
    pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pCVar13->handle).node);
    (this->super_BaseScanner).buffer_handle_ptr = (char *)((pCVar13->handle).node.ptr)->buffer;
    ProcessOverBufferValue(this);
    (this->result).buffer_ptr = (this->super_BaseScanner).buffer_handle_ptr;
    pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    (this->result).buffer_size = pCVar13->actual_size;
    return true;
  }
  pCVar1 = &(this->super_BaseScanner).iterator;
  (pCVar1->pos).buffer_idx = (pCVar1->pos).buffer_idx - 1;
  (this->super_BaseScanner).buffer_handle_ptr = (char *)0x0;
  (this->result).quoted_new_line = false;
  CVar4 = (this->super_BaseScanner).states.states[1];
  if (((((byte)(CVar4 - RECORD_SEPARATOR) < 2) &&
       ((CVar5 = (this->super_BaseScanner).states.states[0], CVar5 == RECORD_SEPARATOR ||
        (CVar5 == NOT_SET)))) ||
      (((byte)(CVar4 - RECORD_SEPARATOR) < 2 &&
       ((byte)((this->super_BaseScanner).states.states[0] - QUOTED) < 0xfe)))) ||
     ((this->result).added_last_line != false)) {
LAB_00d2219e:
    if (((this->result).cur_col_id == (ulong)(this->result).number_of_columns) &&
       (((this->result).super_ScannerResult.states)->states[1] != INVALID)) {
      piVar2 = &(this->result).number_of_rows;
      *piVar2 = *piVar2 + 1;
    }
    (this->result).cur_col_id = 0;
    (this->result).chunk_col_id = 0;
    return false;
  }
  result = &this->result;
  if (0xc < CVar4) goto LAB_00d22201;
  if ((0x860U >> (CVar4 & 0x1f) & 1) != 0) goto LAB_00d2219e;
  if ((0x1080U >> (CVar4 & 0x1f) & 1) == 0) {
    if (CVar4 != 1) goto LAB_00d22201;
    pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
    StringValueResult::AddValue(result,pCVar13->actual_size);
    if ((this->result).super_ScannerResult.comment == true) goto LAB_00d2220a;
  }
  else {
    pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                        (&(this->super_BaseScanner).state_machine);
    if ((pCVar14->dialect_options).state_machine_options.strict_mode.value == true) {
      iVar7 = (this->super_BaseScanner).iterator.pos.buffer_idx;
      iVar8 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      iVar9 = (this->result).buffer_size;
      iVar10 = (this->result).current_line_position.end.buffer_size;
      (this->result).current_line_position.begin.buffer_pos =
           (this->result).current_line_position.end.buffer_pos;
      (this->result).current_line_position.begin.buffer_size = iVar10;
      (this->result).current_line_position.begin.buffer_idx =
           (this->result).current_line_position.end.buffer_idx;
      (this->result).current_line_position.end.buffer_pos = iVar8;
      (this->result).current_line_position.end.buffer_size = iVar9;
      (this->result).current_line_position.end.buffer_idx = iVar7;
      StringValueResult::InvalidState(result);
      return false;
    }
LAB_00d22201:
    if ((this->result).super_ScannerResult.comment == true) {
LAB_00d2220a:
      StringValueResult::UnsetComment(result,(this->super_BaseScanner).iterator.pos.buffer_pos);
      goto LAB_00d22274;
    }
    if ((((result->super_ScannerResult).quoted == true) &&
        ((byte)((this->super_BaseScanner).states.states[0] - DELIMITER_FIRST_BYTE) < 3)) &&
       (pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                            (&(this->super_BaseScanner).state_machine),
       (pCVar14->dialect_options).state_machine_options.strict_mode.value == true)) {
      local_38 = 4;
      LineError::Insert(&(this->result).current_errors,&stack0xffffffffffffffc8,
                        &(this->result).cur_col_id,&(this->result).chunk_col_id,
                        &(this->result).super_ScannerResult.last_position,0);
    }
  }
  pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
  StringValueResult::AddRow(result,pCVar13->actual_size);
LAB_00d22274:
  piVar3 = &(this->super_BaseScanner).lines_read;
  *piVar3 = *piVar3 + 1;
  return false;
}

Assistant:

bool StringValueScanner::MoveToNextBuffer() {
	if (iterator.pos.buffer_pos >= cur_buffer_handle->actual_size) {
		previous_buffer_handle = cur_buffer_handle;
		cur_buffer_handle = buffer_manager->GetBuffer(++iterator.pos.buffer_idx);
		if (!cur_buffer_handle) {
			iterator.pos.buffer_idx--;
			buffer_handle_ptr = nullptr;
			// We do not care if it's a quoted new line on the last row of our file.
			result.quoted_new_line = false;
			// This means we reached the end of the file, we must add a last line if there is any to be added
			if (states.EmptyLine() || states.NewRow() || result.added_last_line || states.IsCurrentNewRow() ||
			    states.IsNotSet()) {
				if (result.cur_col_id == result.number_of_columns && !result.IsStateCurrent(CSVState::INVALID)) {
					result.number_of_rows++;
				}
				result.cur_col_id = 0;
				result.chunk_col_id = 0;
				return false;
			} else if (states.NewValue()) {
				// we add the value
				result.AddValue(result, previous_buffer_handle->actual_size);
				// And an extra empty value to represent what comes after the delimiter
				if (result.IsCommentSet(result)) {
					result.UnsetComment(result, iterator.pos.buffer_pos);
				} else {
					result.AddRow(result, previous_buffer_handle->actual_size);
				}
				lines_read++;
			} else if (states.IsQuotedCurrent() &&
			           state_machine->dialect_options.state_machine_options.strict_mode.GetValue()) {
				// Unterminated quote
				LinePosition current_line_start = {iterator.pos.buffer_idx, iterator.pos.buffer_pos,
				                                   result.buffer_size};
				result.current_line_position.begin = result.current_line_position.end;
				result.current_line_position.end = current_line_start;
				result.InvalidState(result);
			} else {
				if (result.IsCommentSet(result)) {
					result.UnsetComment(result, iterator.pos.buffer_pos);
				} else {
					if (result.quoted && states.IsDelimiterBytes() &&
					    state_machine->dialect_options.state_machine_options.strict_mode.GetValue()) {
						result.current_errors.Insert(UNTERMINATED_QUOTES, result.cur_col_id, result.chunk_col_id,
						                             result.last_position);
					}
					result.AddRow(result, previous_buffer_handle->actual_size);
				}
				lines_read++;
			}
			return false;
		}
		result.buffer_handles[cur_buffer_handle->buffer_idx] = cur_buffer_handle;

		iterator.pos.buffer_pos = 0;
		buffer_handle_ptr = cur_buffer_handle->Ptr();
		// Handle over-buffer value
		ProcessOverBufferValue();
		result.buffer_ptr = buffer_handle_ptr;
		result.buffer_size = cur_buffer_handle->actual_size;
		return true;
	}
	return false;
}